

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,Type *type,
          bool should_consider_suffix)

{
  allocator<char> local_61;
  StructDef *local_60;
  StructDef *sd;
  allocator<char> local_22;
  undefined1 local_21;
  Type *pTStack_20;
  bool should_consider_suffix_local;
  Type *type_local;
  SwiftGenerator *this_local;
  
  local_21 = should_consider_suffix;
  pTStack_20 = type;
  type_local = (Type *)this;
  this_local = (SwiftGenerator *)__return_storage_ptr__;
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"String",&local_22);
    std::allocator<char>::~allocator(&local_22);
    break;
  case BASE_TYPE_VECTOR:
    Type::VectorType((Type *)&sd,type);
    GenType_abi_cxx11_(__return_storage_ptr__,this,(Type *)&sd,false);
    break;
  case BASE_TYPE_STRUCT:
    local_60 = type->struct_def;
    if ((should_consider_suffix) && ((local_60->fixed & 1U) == 0)) {
      IdlNamer::NamespacedObjectType_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,&local_60->super_Definition);
    }
    else {
      IdlNamer::NamespacedType_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,&local_60->super_Definition);
    }
    break;
  case BASE_TYPE_UNION:
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FlatbuffersInitializable",&local_61);
    std::allocator<char>::~allocator(&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypePointer(const Type &type,
                             const bool should_consider_suffix) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenType(type.VectorType());
      case BASE_TYPE_STRUCT: {
        const auto &sd = *type.struct_def;
        if (should_consider_suffix && !sd.fixed) {
          return namer_.NamespacedObjectType(sd);
        }
        return namer_.NamespacedType(sd);
      }
      case BASE_TYPE_UNION:
      default: return "FlatbuffersInitializable";
    }
  }